

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.c
# Opt level: O0

strbuilder * format_entry(stumpless_entry *entry,stumpless_target *target)

{
  size_t size;
  strbuilder *psVar1;
  size_t timestamp_size;
  strbuilder *builder;
  char timestamp [33];
  stumpless_target *target_local;
  stumpless_entry *entry_local;
  
  size = gmtime_r_get_now((char *)&builder);
  lock_entry(entry);
  psVar1 = strbuilder_new();
  psVar1 = strbuilder_append_char(psVar1,'<');
  psVar1 = strbuilder_append_positive_int(psVar1,entry->prival);
  psVar1 = strbuilder_append_string(psVar1,">1 ");
  psVar1 = strbuilder_append_buffer(psVar1,(char *)&builder,size);
  psVar1 = strbuilder_append_char(psVar1,' ');
  if (entry->hostname_length == 0) {
    timestamp_size = (size_t)strbuilder_append_hostname(psVar1);
  }
  else {
    timestamp_size = (size_t)strbuilder_append_buffer(psVar1,entry->hostname,entry->hostname_length)
    ;
  }
  psVar1 = strbuilder_append_char((strbuilder *)timestamp_size,' ');
  psVar1 = strbuilder_append_app_name(psVar1,entry);
  psVar1 = strbuilder_append_char(psVar1,' ');
  if ((target->options & 1U) == 0) {
    timestamp_size = (size_t)strbuilder_append_char(psVar1,'-');
  }
  else if (entry->procid_length == 0) {
    timestamp_size = (size_t)strbuilder_append_procid(psVar1);
  }
  else {
    timestamp_size = (size_t)strbuilder_append_buffer(psVar1,entry->procid,entry->procid_length);
  }
  psVar1 = strbuilder_append_char((strbuilder *)timestamp_size,' ');
  psVar1 = strbuilder_append_msgid(psVar1,entry);
  psVar1 = strbuilder_append_char(psVar1,' ');
  timestamp_size = (size_t)strbuilder_append_structured_data(psVar1,entry);
  if (entry->message_length != 0) {
    psVar1 = strbuilder_append_char((strbuilder *)timestamp_size,' ');
    timestamp_size = (size_t)strbuilder_append_message(psVar1,entry);
  }
  psVar1 = strbuilder_append_char((strbuilder *)timestamp_size,'\n');
  unlock_entry(entry);
  return psVar1;
}

Assistant:

struct strbuilder *
format_entry( const struct stumpless_entry *entry,
              const struct stumpless_target *target ) {
  char timestamp[RFC_5424_TIMESTAMP_BUFFER_SIZE];
  struct strbuilder *builder;
  size_t timestamp_size;

  // do this as soon as possible to be closer to invocation
  timestamp_size = config_get_now( timestamp );

  lock_entry( entry );

  builder = strbuilder_new(  );
  builder = strbuilder_append_char( builder, '<' );
  builder = strbuilder_append_positive_int( builder, entry->prival );
  builder = strbuilder_append_string( builder, ">1 " );
  builder = strbuilder_append_buffer( builder, timestamp, timestamp_size );
  builder = strbuilder_append_char( builder, ' ' );

  if( entry->hostname_length > 0 ) {
    builder = strbuilder_append_buffer( builder,
                                        entry->hostname,
                                        entry->hostname_length );
  } else {
    builder = strbuilder_append_hostname( builder );
  }

  builder = strbuilder_append_char( builder, ' ' );
  builder = strbuilder_append_app_name( builder, entry );
  builder = strbuilder_append_char( builder, ' ' );
  if( target->options & STUMPLESS_OPTION_PID ) {
    if( entry->procid_length > 0 ) {
      builder = strbuilder_append_buffer( builder,
                                          entry->procid,
                                          entry->procid_length );
    } else {
      builder = strbuilder_append_procid( builder );
    }
  } else {
    builder = strbuilder_append_char( builder, RFC_5424_NILVALUE );
  }
  builder = strbuilder_append_char( builder, ' ' );
  builder = strbuilder_append_msgid( builder, entry );
  builder = strbuilder_append_char( builder, ' ' );
  builder = strbuilder_append_structured_data( builder, entry );

  if( entry->message_length > 0 ) {
    builder = strbuilder_append_char( builder, ' ' );
    builder = strbuilder_append_message( builder, entry );
  }

  builder = strbuilder_append_char( builder, '\n' );

  unlock_entry( entry );

  return builder;
}